

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2780404::
SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
::SetUp(SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
        *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _func_uint_uchar_ptr_int_int_int_uchar_ptr_int_uint_ptr_uchar_ptr *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 uVar6;
  undefined8 *puVar7;
  bool bVar8;
  void *pvVar9;
  uint8_t *puVar10;
  pointer *__ptr;
  size_t size;
  SEARCH_METHODS *pSVar11;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  GTestLog local_28 [2];
  undefined8 *local_20;
  
  bVar8 = testing::internal::IsTrue
                    (testing::
                     WithParamInterface<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,unsigned_char_const*,int,unsigned_int*,unsigned_char_const*)>>
                     ::parameter_ != (undefined8 *)0x0);
  if (!bVar8) {
    testing::internal::GTestLog::GTestLog
              (local_28,GTEST_FATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/gtest.h"
               ,0x67d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition parameter_ != nullptr failed. ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "GetParam() can only be called inside a value-parameterized test ",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"-- did you intend to write TEST_P instead of TEST_F?",0x34);
    testing::internal::GTestLog::~GTestLog(local_28);
  }
  uVar1 = *testing::
           WithParamInterface<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,unsigned_char_const*,int,unsigned_int*,unsigned_char_const*)>>
           ::parameter_;
  uVar2 = testing::
          WithParamInterface<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,unsigned_char_const*,int,unsigned_int*,unsigned_char_const*)>>
          ::parameter_[1];
  p_Var3 = (_func_uint_uchar_ptr_int_int_int_uchar_ptr_int_uint_ptr_uchar_ptr *)
           testing::
           WithParamInterface<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,unsigned_char_const*,int,unsigned_int*,unsigned_char_const*)>>
           ::parameter_[3];
  uVar4 = *(undefined8 *)
           ((long)testing::
                  WithParamInterface<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,unsigned_char_const*,int,unsigned_int*,unsigned_char_const*)>>
                  ::parameter_ + 0x1c);
  uVar5 = *(undefined8 *)
           ((long)testing::
                  WithParamInterface<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,unsigned_char_const*,int,unsigned_int*,unsigned_char_const*)>>
                  ::parameter_ + 0x24);
  *(undefined8 *)&(this->params_).block_size =
       testing::
       WithParamInterface<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,unsigned_char_const*,int,unsigned_int*,unsigned_char_const*)>>
       ::parameter_[2];
  (this->params_).func = p_Var3;
  *(undefined8 *)((long)&(this->params_).func + 4) = uVar4;
  (this->params_).use_high_bit_depth = (bool)(char)uVar5;
  *(int3 *)&(this->params_).field_0x25 = (int3)((ulong)uVar5 >> 8);
  (this->params_).mask = (int)((ulong)uVar5 >> 0x20);
  (this->params_).log2width = (int)uVar1;
  (this->params_).log2height = (int)((ulong)uVar1 >> 0x20);
  (this->params_).width = (int)uVar2;
  (this->params_).height = (int)((ulong)uVar2 >> 0x20);
  (this->rnd_).random_.state_ = 0xbaba;
  size = (size_t)(this->params_).block_size;
  if ((this->params_).use_high_bit_depth == false) {
    puVar10 = (uint8_t *)aom_memalign(0x20,size);
    this->src_ = puVar10;
    puVar10 = (uint8_t *)aom_memalign(0x20,(long)(this->params_).block_size);
    this->sec_ = puVar10;
    puVar10 = (uint8_t *)
              aom_memalign(0x20,(long)((this->params_).height +
                                       (this->params_).block_size + (this->params_).width + 1));
  }
  else {
    pvVar9 = aom_memalign(0x20,size * 2);
    this->src_ = (uint8_t *)((ulong)pvVar9 >> 1);
    pvVar9 = aom_memalign(0x20,(long)(this->params_).block_size * 2);
    this->sec_ = (uint8_t *)((ulong)pvVar9 >> 1);
    pvVar9 = aom_memalign(0x20,(long)((this->params_).block_size + (this->params_).width +
                                      (this->params_).height + 1) * 2);
    puVar10 = (uint8_t *)((ulong)pvVar9 >> 1);
  }
  this->ref_ = puVar10;
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            ((internal *)local_28,"src_","nullptr",&this->src_,&local_38._M_head_impl);
  uVar6 = (undefined1)local_28[0].severity_;
  if ((internal)(undefined1)local_28[0].severity_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (undefined8 *)0x0) {
      pSVar11 = "";
    }
    else {
      pSVar11 = (SEARCH_METHODS *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
               ,0x4de,(char *)pSVar11);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  puVar7 = local_20;
  if (local_20 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_20 != local_20 + 2) {
      operator_delete((undefined8 *)*local_20);
    }
    operator_delete(puVar7);
  }
  if ((internal)uVar6 != (internal)0x0) {
    local_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              ((internal *)local_28,"sec_","nullptr",&this->sec_,&local_38._M_head_impl);
    uVar6 = (undefined1)local_28[0].severity_;
    if ((internal)(undefined1)local_28[0].severity_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_20 == (undefined8 *)0x0) {
        pSVar11 = "";
      }
      else {
        pSVar11 = (SEARCH_METHODS *)*local_20;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x4df,(char *)pSVar11);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    puVar7 = local_20;
    if (local_20 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_20 != local_20 + 2) {
        operator_delete((undefined8 *)*local_20);
      }
      operator_delete(puVar7);
    }
    if ((internal)uVar6 != (internal)0x0) {
      local_38._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
                ((internal *)local_28,"ref_","nullptr",&this->ref_,&local_38._M_head_impl);
      if ((internal)(undefined1)local_28[0].severity_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (local_20 == (undefined8 *)0x0) {
          pSVar11 = "";
        }
        else {
          pSVar11 = (SEARCH_METHODS *)*local_20;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x4e0,(char *)pSVar11);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        if (local_38._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_38._M_head_impl + 8))();
        }
      }
      if (local_20 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_20 != local_20 + 2) {
          operator_delete((undefined8 *)*local_20);
        }
        operator_delete(local_20);
      }
    }
  }
  return;
}

Assistant:

void SetUp() override {
    params_ = this->GetParam();

    rnd_.Reset(ACMRandom::DeterministicSeed());
    if (!use_high_bit_depth()) {
      src_ = reinterpret_cast<uint8_t *>(aom_memalign(32, block_size()));
      sec_ = reinterpret_cast<uint8_t *>(aom_memalign(32, block_size()));
      ref_ = reinterpret_cast<uint8_t *>(
          aom_memalign(32, block_size() + width() + height() + 1));
    } else {
      src_ = CONVERT_TO_BYTEPTR(reinterpret_cast<uint16_t *>(
          aom_memalign(32, block_size() * sizeof(uint16_t))));
      sec_ = CONVERT_TO_BYTEPTR(reinterpret_cast<uint16_t *>(
          aom_memalign(32, block_size() * sizeof(uint16_t))));
      ref_ = CONVERT_TO_BYTEPTR(aom_memalign(
          32, (block_size() + width() + height() + 1) * sizeof(uint16_t)));
    }
    ASSERT_NE(src_, nullptr);
    ASSERT_NE(sec_, nullptr);
    ASSERT_NE(ref_, nullptr);
  }